

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O1

void __thiscall ftxui::anon_unknown_0::Border::ComputeRequirement(Border *this)

{
  int *piVar1;
  Box *pBVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  
  Node::ComputeRequirement(&this->super_Node);
  psVar3 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar5 = (psVar3->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)((long)&peVar5->requirement_ + 0x20);
  iVar11 = *(int *)((long)&peVar5->requirement_ + 0x28);
  iVar10 = (peVar5->requirement_).min_y;
  uVar7 = *(undefined8 *)((long)&peVar5->requirement_ + 8);
  uVar8 = *(undefined8 *)((long)&peVar5->requirement_ + 0x10);
  uVar9 = *(undefined8 *)((long)&peVar5->requirement_ + 0x18);
  (this->super_Node).requirement_.min_x = (peVar5->requirement_).min_x;
  (this->super_Node).requirement_.min_y = iVar10;
  *(undefined8 *)&(this->super_Node).requirement_.flex_grow_x = uVar7;
  (this->super_Node).requirement_.selected_box.y_max = iVar11;
  *(undefined8 *)&(this->super_Node).requirement_.selected_box.x_max = uVar6;
  *(undefined8 *)&(this->super_Node).requirement_.flex_shrink_x = uVar8;
  *(undefined8 *)&(this->super_Node).requirement_.selection = uVar9;
  iVar11 = (this->super_Node).requirement_.min_x + 2;
  (this->super_Node).requirement_.min_x = iVar11;
  piVar1 = &(this->super_Node).requirement_.min_y;
  *piVar1 = *piVar1 + 2;
  if ((long)psVar4 - (long)psVar3 == 0x20) {
    iVar10 = ((psVar3[1].super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_x + 2;
    if (iVar10 < iVar11) {
      iVar10 = iVar11;
    }
    (this->super_Node).requirement_.min_x = iVar10;
  }
  pBVar2 = &(this->super_Node).requirement_.selected_box;
  pBVar2->x_min = pBVar2->x_min + 1;
  piVar1 = &(this->super_Node).requirement_.selected_box.x_max;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(this->super_Node).requirement_.selected_box.y_min;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(this->super_Node).requirement_.selected_box.y_max;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void ComputeRequirement() override {
    Node::ComputeRequirement();
    requirement_ = children_[0]->requirement();
    requirement_.min_x += 2;
    requirement_.min_y += 2;
    if (children_.size() == 2) {
      requirement_.min_x =
          std::max(requirement_.min_x, children_[1]->requirement().min_x + 2);
    }
    requirement_.selected_box.x_min++;
    requirement_.selected_box.x_max++;
    requirement_.selected_box.y_min++;
    requirement_.selected_box.y_max++;
  }